

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation_test.cc
# Opt level: O3

void __thiscall
DebugAllocationTest_DeallocMismatch_Test::TestBody(DebugAllocationTest_DeallocMismatch_Test *this)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  StringLike<const_char_*> *regex;
  StringLike<const_char_*> *regex_00;
  StringLike<const_char_*> *regex_01;
  StringLike<const_char_*> *regex_02;
  StringLike<const_char_*> *regex_03;
  StringLike<const_char_*> *regex_04;
  StringLike<const_char_*> *regex_05;
  StringLike<const_char_*> *regex_06;
  StringLike<const_char_*> *regex_07;
  StringLike<const_char_*> *regex_08;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var7;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_160;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_148;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_130;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_118;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_100;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_e8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_d0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_b8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_88;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  AssertHelper local_40;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  DeathTest *gtest_dt;
  
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)malloc(4);
  (*noopt_helper)(&local_60);
  _Var1._M_head_impl = local_60._M_head_impl;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_40.data_ = (AssertHelperData *)0x13e09b;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_60,
               (testing *)&local_40,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_160,(PolymorphicMatcher *)&local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("delete x",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_160,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x42,(DeathTest **)&local_38);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_160);
    _Var7._M_head_impl = local_38;
    if (!bVar3) goto LAB_0010aed9;
    if (local_38 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      iVar4 = (**(code **)(*(long *)local_38 + 0x10))(local_38);
      pbVar2 = local_38;
      if (iVar4 == 0) {
        iVar4 = (**(code **)(*(long *)local_38 + 0x18))(local_38);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (**(code **)(*(long *)pbVar2 + 0x20))(pbVar2,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (**(code **)(*(long *)_Var7._M_head_impl + 8))(_Var7._M_head_impl);
          goto LAB_0010aed9;
        }
      }
      else if (iVar4 == 1) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          operator_delete(_Var1._M_head_impl,4);
        }
        (**(code **)(*(long *)local_38 + 0x28))(local_38,2);
        (**(code **)(*(long *)pbVar2 + 0x28))(pbVar2,0);
      }
      lVar6 = *(long *)_Var7._M_head_impl;
      goto LAB_0010af26;
    }
  }
  else {
LAB_0010aed9:
    testing::Message::Message((Message *)&local_60);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x42,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar6 = *(long *)local_60._M_head_impl;
      _Var7._M_head_impl = local_60._M_head_impl;
LAB_0010af26:
      (**(code **)(lVar6 + 8))(_Var7._M_head_impl);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_40.data_ = (AssertHelperData *)0x13e12e;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_60,
               (testing *)&local_40,regex_00);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_148,(PolymorphicMatcher *)&local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("delete [] x",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_148,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x43,(DeathTest **)&local_38);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_148);
    _Var7._M_head_impl = local_38;
    if (!bVar3) goto LAB_0010b035;
    if (local_38 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      iVar4 = (**(code **)(*(long *)local_38 + 0x10))(local_38);
      pbVar2 = local_38;
      if (iVar4 == 0) {
        iVar4 = (**(code **)(*(long *)local_38 + 0x18))(local_38);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (**(code **)(*(long *)pbVar2 + 0x20))(pbVar2,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (**(code **)(*(long *)_Var7._M_head_impl + 8))(_Var7._M_head_impl);
          goto LAB_0010b035;
        }
      }
      else if (iVar4 == 1) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3 && _Var1._M_head_impl !=
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          operator_delete__(_Var1._M_head_impl);
        }
        (**(code **)(*(long *)local_38 + 0x28))(local_38,2);
        (**(code **)(*(long *)pbVar2 + 0x28))(pbVar2,0);
      }
      lVar6 = *(long *)_Var7._M_head_impl;
      goto LAB_0010b082;
    }
  }
  else {
LAB_0010b035:
    testing::Message::Message((Message *)&local_60);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x43,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar6 = *(long *)local_60._M_head_impl;
      _Var7._M_head_impl = local_60._M_head_impl;
LAB_0010b082:
      (**(code **)(lVar6 + 8))(_Var7._M_head_impl);
    }
  }
  free(_Var1._M_head_impl);
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(4);
  (*noopt_helper)(&local_60);
  _Var1._M_head_impl = local_60._M_head_impl;
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(4);
  (*noopt_helper)(&local_60);
  _Var7._M_head_impl = local_60._M_head_impl;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_40.data_ = (AssertHelperData *)0x13e15b;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_60,
               (testing *)&local_40,regex_01);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_130,(PolymorphicMatcher *)&local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("free(x)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_130,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x4c,(DeathTest **)&local_38);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_130);
    _Var8._M_head_impl = local_38;
    if (!bVar3) goto LAB_0010b1d0;
    if (local_38 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      iVar4 = (**(code **)(*(long *)local_38 + 0x10))(local_38);
      pbVar2 = local_38;
      if (iVar4 == 0) {
        iVar4 = (**(code **)(*(long *)local_38 + 0x18))(local_38);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (**(code **)(*(long *)pbVar2 + 0x20))(pbVar2,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (**(code **)(*(long *)_Var8._M_head_impl + 8))(_Var8._M_head_impl);
          goto LAB_0010b1d0;
        }
      }
      else if (iVar4 == 1) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          free(_Var1._M_head_impl);
        }
        (**(code **)(*(long *)local_38 + 0x28))(local_38,2);
        (**(code **)(*(long *)pbVar2 + 0x28))(pbVar2,0);
      }
      lVar6 = *(long *)_Var8._M_head_impl;
      goto LAB_0010b21d;
    }
  }
  else {
LAB_0010b1d0:
    testing::Message::Message((Message *)&local_60);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x4c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar6 = *(long *)local_60._M_head_impl;
      _Var8._M_head_impl = local_60._M_head_impl;
LAB_0010b21d:
      (**(code **)(lVar6 + 8))(_Var8._M_head_impl);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_40.data_ = (AssertHelperData *)0x13e12e;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_60,
               (testing *)&local_40,regex_02);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_118,(PolymorphicMatcher *)&local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("delete [] x",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_118,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x4d,(DeathTest **)&local_38);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_118);
    _Var8._M_head_impl = local_38;
    if (!bVar3) goto LAB_0010b32f;
    if (local_38 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      iVar4 = (**(code **)(*(long *)local_38 + 0x10))(local_38);
      pbVar2 = local_38;
      if (iVar4 == 0) {
        iVar4 = (**(code **)(*(long *)local_38 + 0x18))(local_38);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (**(code **)(*(long *)pbVar2 + 0x20))(pbVar2,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (**(code **)(*(long *)_Var8._M_head_impl + 8))(_Var8._M_head_impl);
          goto LAB_0010b32f;
        }
      }
      else if (iVar4 == 1) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3 && _Var1._M_head_impl !=
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          operator_delete__(_Var1._M_head_impl);
        }
        (**(code **)(*(long *)local_38 + 0x28))(local_38,2);
        (**(code **)(*(long *)pbVar2 + 0x28))(pbVar2,0);
      }
      lVar6 = *(long *)_Var8._M_head_impl;
      goto LAB_0010b37c;
    }
  }
  else {
LAB_0010b32f:
    testing::Message::Message((Message *)&local_60);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x4d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar6 = *(long *)local_60._M_head_impl;
      _Var8._M_head_impl = local_60._M_head_impl;
LAB_0010b37c:
      (**(code **)(lVar6 + 8))(_Var8._M_head_impl);
    }
  }
  operator_delete(_Var1._M_head_impl,4);
  operator_delete(_Var7._M_head_impl,(nothrow_t *)&std::nothrow);
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new__(4);
  (*noopt_helper)(&local_60);
  _Var1._M_head_impl = local_60._M_head_impl;
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new__(4);
  (*noopt_helper)(&local_60);
  _Var7._M_head_impl = local_60._M_head_impl;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_40.data_ = (AssertHelperData *)0x13e15b;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_60,
               (testing *)&local_40,regex_03);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_100,(PolymorphicMatcher *)&local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("free(x)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_100,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x56,(DeathTest **)&local_38);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_100);
    _Var8._M_head_impl = local_38;
    if (!bVar3) goto LAB_0010b4de;
    if (local_38 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      iVar4 = (**(code **)(*(long *)local_38 + 0x10))(local_38);
      pbVar2 = local_38;
      if (iVar4 == 0) {
        iVar4 = (**(code **)(*(long *)local_38 + 0x18))(local_38);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (**(code **)(*(long *)pbVar2 + 0x20))(pbVar2,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (**(code **)(*(long *)_Var8._M_head_impl + 8))(_Var8._M_head_impl);
          goto LAB_0010b4de;
        }
      }
      else if (iVar4 == 1) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          free(_Var1._M_head_impl);
        }
        (**(code **)(*(long *)local_38 + 0x28))(local_38,2);
        (**(code **)(*(long *)pbVar2 + 0x28))(pbVar2,0);
      }
      lVar6 = *(long *)_Var8._M_head_impl;
      goto LAB_0010b52b;
    }
  }
  else {
LAB_0010b4de:
    testing::Message::Message((Message *)&local_60);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x56,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar6 = *(long *)local_60._M_head_impl;
      _Var8._M_head_impl = local_60._M_head_impl;
LAB_0010b52b:
      (**(code **)(lVar6 + 8))(_Var8._M_head_impl);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_40.data_ = (AssertHelperData *)0x13e09b;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_60,
               (testing *)&local_40,regex_04);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_e8,(PolymorphicMatcher *)&local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("delete x",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_e8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x57,(DeathTest **)&local_38);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_e8);
    _Var8._M_head_impl = local_38;
    if (!bVar3) goto LAB_0010b63a;
    if (local_38 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      iVar4 = (**(code **)(*(long *)local_38 + 0x10))(local_38);
      pbVar2 = local_38;
      if (iVar4 == 0) {
        iVar4 = (**(code **)(*(long *)local_38 + 0x18))(local_38);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (**(code **)(*(long *)pbVar2 + 0x20))(pbVar2,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (**(code **)(*(long *)_Var8._M_head_impl + 8))(_Var8._M_head_impl);
          goto LAB_0010b63a;
        }
      }
      else if (iVar4 == 1) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          operator_delete(_Var1._M_head_impl,4);
        }
        (**(code **)(*(long *)local_38 + 0x28))(local_38,2);
        (**(code **)(*(long *)pbVar2 + 0x28))(pbVar2,0);
      }
      lVar6 = *(long *)_Var8._M_head_impl;
      goto LAB_0010b687;
    }
  }
  else {
LAB_0010b63a:
    testing::Message::Message((Message *)&local_60);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x57,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar6 = *(long *)local_60._M_head_impl;
      _Var8._M_head_impl = local_60._M_head_impl;
LAB_0010b687:
      (**(code **)(lVar6 + 8))(_Var8._M_head_impl);
    }
  }
  if (_Var1._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(_Var1._M_head_impl);
  }
  operator_delete__(_Var7._M_head_impl,(nothrow_t *)&std::nothrow);
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       operator_new(4,(nothrow_t *)&std::nothrow);
  (*noopt_helper)(&local_60);
  _Var1._M_head_impl = local_60._M_head_impl;
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       operator_new(4,(nothrow_t *)&std::nothrow);
  (*noopt_helper)(&local_60);
  _Var7._M_head_impl = local_60._M_head_impl;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_40.data_ = (AssertHelperData *)0x13e15b;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_60,
               (testing *)&local_40,regex_05);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_d0,(PolymorphicMatcher *)&local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("free(x)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_d0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x60,(DeathTest **)&local_38);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_d0);
    _Var8._M_head_impl = local_38;
    if (!bVar3) goto LAB_0010b7f2;
    if (local_38 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      iVar4 = (**(code **)(*(long *)local_38 + 0x10))(local_38);
      pbVar2 = local_38;
      if (iVar4 == 0) {
        iVar4 = (**(code **)(*(long *)local_38 + 0x18))(local_38);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (**(code **)(*(long *)pbVar2 + 0x20))(pbVar2,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (**(code **)(*(long *)_Var8._M_head_impl + 8))(_Var8._M_head_impl);
          goto LAB_0010b7f2;
        }
      }
      else if (iVar4 == 1) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          free(_Var1._M_head_impl);
        }
        (**(code **)(*(long *)local_38 + 0x28))(local_38,2);
        (**(code **)(*(long *)pbVar2 + 0x28))(pbVar2,0);
      }
      lVar6 = *(long *)_Var8._M_head_impl;
      goto LAB_0010b83f;
    }
  }
  else {
LAB_0010b7f2:
    testing::Message::Message((Message *)&local_60);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x60,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar6 = *(long *)local_60._M_head_impl;
      _Var8._M_head_impl = local_60._M_head_impl;
LAB_0010b83f:
      (**(code **)(lVar6 + 8))(_Var8._M_head_impl);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_40.data_ = (AssertHelperData *)0x13e12e;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_60,
               (testing *)&local_40,regex_06);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_b8,(PolymorphicMatcher *)&local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("delete [] x",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_b8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x61,(DeathTest **)&local_38);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_b8);
    _Var8._M_head_impl = local_38;
    if (!bVar3) goto LAB_0010b951;
    if (local_38 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      iVar4 = (**(code **)(*(long *)local_38 + 0x10))(local_38);
      pbVar2 = local_38;
      if (iVar4 == 0) {
        iVar4 = (**(code **)(*(long *)local_38 + 0x18))(local_38);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (**(code **)(*(long *)pbVar2 + 0x20))(pbVar2,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (**(code **)(*(long *)_Var8._M_head_impl + 8))(_Var8._M_head_impl);
          goto LAB_0010b951;
        }
      }
      else if (iVar4 == 1) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3 && _Var1._M_head_impl !=
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          operator_delete__(_Var1._M_head_impl);
        }
        (**(code **)(*(long *)local_38 + 0x28))(local_38,2);
        (**(code **)(*(long *)pbVar2 + 0x28))(pbVar2,0);
      }
      lVar6 = *(long *)_Var8._M_head_impl;
      goto LAB_0010b99e;
    }
  }
  else {
LAB_0010b951:
    testing::Message::Message((Message *)&local_60);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x61,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar6 = *(long *)local_60._M_head_impl;
      _Var8._M_head_impl = local_60._M_head_impl;
LAB_0010b99e:
      (**(code **)(lVar6 + 8))(_Var8._M_head_impl);
    }
  }
  operator_delete(_Var1._M_head_impl,4);
  operator_delete(_Var7._M_head_impl,(nothrow_t *)&std::nothrow);
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       operator_new__(4,(nothrow_t *)&std::nothrow);
  (*noopt_helper)(&local_60);
  _Var1._M_head_impl = local_60._M_head_impl;
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       operator_new__(4,(nothrow_t *)&std::nothrow);
  (*noopt_helper)(&local_60);
  _Var7._M_head_impl = local_60._M_head_impl;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_40.data_ = (AssertHelperData *)0x13e15b;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_60,
               (testing *)&local_40,regex_07);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_a0,(PolymorphicMatcher *)&local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("free(x)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_a0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x6a,(DeathTest **)&local_38);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_a0);
    _Var8._M_head_impl = local_38;
    if (!bVar3) goto LAB_0010bb09;
    if (local_38 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      iVar4 = (**(code **)(*(long *)local_38 + 0x10))(local_38);
      pbVar2 = local_38;
      if (iVar4 == 0) {
        iVar4 = (**(code **)(*(long *)local_38 + 0x18))(local_38);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (**(code **)(*(long *)pbVar2 + 0x20))(pbVar2,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (**(code **)(*(long *)_Var8._M_head_impl + 8))(_Var8._M_head_impl);
          goto LAB_0010bb09;
        }
      }
      else if (iVar4 == 1) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          free(_Var1._M_head_impl);
        }
        (**(code **)(*(long *)local_38 + 0x28))(local_38,2);
        (**(code **)(*(long *)pbVar2 + 0x28))(pbVar2,0);
      }
      lVar6 = *(long *)_Var8._M_head_impl;
      goto LAB_0010bb56;
    }
  }
  else {
LAB_0010bb09:
    testing::Message::Message((Message *)&local_60);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x6a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar6 = *(long *)local_60._M_head_impl;
      _Var8._M_head_impl = local_60._M_head_impl;
LAB_0010bb56:
      (**(code **)(lVar6 + 8))(_Var8._M_head_impl);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_40.data_ = (AssertHelperData *)0x13e09b;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_60,
               (testing *)&local_40,regex_08);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_88,(PolymorphicMatcher *)&local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("delete x",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_88,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x6b,(DeathTest **)&local_38);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_88);
    _Var8._M_head_impl = local_38;
    if (!bVar3) goto LAB_0010bc5c;
    if (local_38 == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0010bcac;
    iVar4 = (**(code **)(*(long *)local_38 + 0x10))(local_38);
    pbVar2 = local_38;
    if (iVar4 == 0) {
      iVar4 = (**(code **)(*(long *)local_38 + 0x18))(local_38);
      bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
      iVar4 = (**(code **)(*(long *)local_38 + 0x20))(local_38,(ulong)bVar3);
      if ((char)iVar4 == '\0') {
        (**(code **)(*(long *)_Var8._M_head_impl + 8))(_Var8._M_head_impl);
        goto LAB_0010bc5c;
      }
    }
    else if (iVar4 == 1) {
      bVar3 = testing::internal::AlwaysTrue();
      if (bVar3) {
        operator_delete(_Var1._M_head_impl,4);
      }
      (**(code **)(*(long *)local_38 + 0x28))(local_38,2);
      (**(code **)(*(long *)pbVar2 + 0x28))(pbVar2,0);
    }
    lVar6 = *(long *)_Var8._M_head_impl;
  }
  else {
LAB_0010bc5c:
    testing::Message::Message((Message *)&local_60);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x6b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_60._M_head_impl ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0010bcac;
    lVar6 = *(long *)local_60._M_head_impl;
    _Var8._M_head_impl = local_60._M_head_impl;
  }
  (**(code **)(lVar6 + 8))(_Var8._M_head_impl);
LAB_0010bcac:
  if (_Var1._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(_Var1._M_head_impl);
  }
  operator_delete__(_Var7._M_head_impl,(nothrow_t *)&std::nothrow);
  return;
}

Assistant:

TEST(DebugAllocationTest, DeallocMismatch) {
  // malloc can be matched only by free
  // new can be matched only by delete and delete(nothrow)
  // new[] can be matched only by delete[] and delete[](nothrow)
  // new(nothrow) can be matched only by delete and delete(nothrow)
  // new(nothrow)[] can be matched only by delete[] and delete[](nothrow)

  // Allocate with malloc.
  {
    int* x = static_cast<int*>(noopt(malloc(sizeof(*x))));
    EXPECT_DEATH(delete x, "mismatch.*being dealloc.*delete");
    EXPECT_DEATH(delete [] x, "mismatch.*being dealloc.*delete *[[]");
    // Should work fine.
    free(x);
  }

  // Allocate with new.
  {
    int* x = noopt(new int);
    int* y = noopt(new int);
    EXPECT_DEATH(free(x), "mismatch.*being dealloc.*free");
    EXPECT_DEATH(delete [] x, "mismatch.*being dealloc.*delete *[[]");
    delete x;
    ::operator delete(y, std::nothrow);
  }

  // Allocate with new[].
  {
    int* x = noopt(new int[1]);
    int* y = noopt(new int[1]);
    EXPECT_DEATH(free(x), "mismatch.*being dealloc.*free");
    EXPECT_DEATH(delete x, "mismatch.*being dealloc.*delete");
    delete [] x;
    ::operator delete[](y, std::nothrow);
  }

  // Allocate with new(nothrow).
  {
    int* x = noopt(new (std::nothrow) int);
    int* y = noopt(new (std::nothrow) int);
    EXPECT_DEATH(free(x), "mismatch.*being dealloc.*free");
    EXPECT_DEATH(delete [] x, "mismatch.*being dealloc.*delete *[[]");
    delete x;
    ::operator delete(y, std::nothrow);
  }

  // Allocate with new(nothrow)[].
  {
    int* x = noopt(new (std::nothrow) int[1]);
    int* y = noopt(new (std::nothrow) int[1]);
    EXPECT_DEATH(free(x), "mismatch.*being dealloc.*free");
    EXPECT_DEATH(delete x, "mismatch.*being dealloc.*delete");
    delete [] x;
    ::operator delete[](y, std::nothrow);
  }
}